

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

DatatypeValidator *
xercesc_4_0::DatatypeValidatorFactory::getBuiltInBaseValidator(DatatypeValidator *dv)

{
  DVHashTable *this;
  XMLCh *key;
  DatatypeValidator *pDVar1;
  DatatypeValidator *local_20;
  DatatypeValidator *curdv;
  DatatypeValidator *dv_local;
  
  local_20 = dv;
  while( true ) {
    if (local_20 == (DatatypeValidator *)0x0) {
      return (DatatypeValidator *)0x0;
    }
    this = getBuiltInRegistry();
    key = DatatypeValidator::getTypeLocalName(local_20);
    pDVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                       (this,key);
    if (local_20 == pDVar1) break;
    local_20 = DatatypeValidator::getBaseValidator(local_20);
  }
  return local_20;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::getBuiltInBaseValidator(const DatatypeValidator* const dv)
{
    DatatypeValidator *curdv = (DatatypeValidator*)dv;

    while (curdv)
    {
        if (curdv == getBuiltInRegistry()->get(curdv->getTypeLocalName()))
            return curdv;
        else
            curdv = curdv->getBaseValidator();
     }

     return 0;
}